

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta)

{
  int iVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar2;
  longdouble lVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 extraout_RAX;
  long lVar6;
  long lVar7;
  long lVar8;
  _Head_base<0UL,_int_*,_false> _Var9;
  uint uVar10;
  type it;
  int iVar11;
  rc_data *ret;
  rc_data *__first;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  rc_data *__last;
  long lVar15;
  longdouble lVar16;
  longdouble lVar17;
  double dVar18;
  undefined1 local_a0 [16];
  _Head_base<0UL,_int_*,_false> local_90;
  int local_84;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_80;
  long local_78;
  undefined1 local_70 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_60;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_58;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_50;
  long local_48;
  longdouble local_3c;
  
  local_3c = theta;
  if (first._M_current != last._M_current) {
    local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
    lVar16 = kappa / ((longdouble)1 - kappa);
    local_58._M_head_impl = (row_value *)last._M_current;
    do {
      if (*(int *)(this + 0x80) <= *first._M_current) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
LAB_0019e368:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      iVar11 = (int)local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
      local_80._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
              )(long)*first._M_current;
      local_50._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_a0,iVar11);
      if (local_a0._8_8_ != local_a0._0_8_) {
        lVar15 = *(long *)(this + 0x68);
        _Var9._M_head_impl = (int *)local_a0._8_8_;
        do {
          *(longdouble *)(lVar15 + (long)*_Var9._M_head_impl * 0x10) =
               *(longdouble *)(lVar15 + (long)*_Var9._M_head_impl * 0x10) * local_3c;
          _Var9._M_head_impl = _Var9._M_head_impl + 8;
        } while (_Var9._M_head_impl != (int *)local_a0._0_8_);
      }
      if (local_a0._8_8_ == local_a0._0_8_) {
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        _Var9._M_head_impl = (int *)local_a0._8_8_;
        do {
          sparse_matrix<int>::column((sparse_matrix<int> *)local_70,iVar11);
          lVar17 = (longdouble)0;
          if (local_70._8_8_ != local_70._0_8_) {
            lVar17 = (longdouble)0;
            do {
              local_84 = *(int *)(*(long *)(this + 0x48) + (long)*(int *)local_70._8_8_ * 4);
              lVar17 = *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)local_70._8_8_ * 0x10)
                       * (longdouble)local_84 + lVar17;
              local_70._8_8_ = local_70._8_8_ + 8;
            } while (local_70._8_8_ != local_70._0_8_);
          }
          lVar15 = *(long *)(this + 0x50);
          lVar6 = uVar14 * 0x20;
          *(int *)(lVar15 + 0x10 + lVar6) = (int)uVar14;
          *(undefined4 *)(lVar15 + 0x14 + lVar6) =
               *(undefined4 *)(*(long *)(this + 0x48) + (long)*_Var9._M_head_impl * 4);
          *(longdouble *)(lVar15 + lVar6) =
               *(longdouble *)
                (*(long *)(*(long *)(this + 0x70) + 8) + (long)*(int *)(local_a0._8_8_ + 4) * 0x10)
               - lVar17;
          _Var9._M_head_impl = _Var9._M_head_impl + 2;
          uVar14 = uVar14 + 1;
        } while (_Var9._M_head_impl != (int *)local_a0._0_8_);
      }
      uVar13 = (uint)uVar14;
      uVar14 = uVar14 & 0xffffffff;
      if (1 < uVar13) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + uVar14,(int)LZCOUNT(uVar14) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + uVar14);
        __last = __first + 1;
        lVar15 = uVar14 * 0x20 + -0x20;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar15 = lVar15 + -0x20;
        } while (lVar15 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      local_78 = (long)local_80._M_t.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl * 3;
      if (*(int *)(*(long *)(this + 0x58) +
                  (long)local_80._M_t.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                        _M_head_impl * 0xc) < 1) {
        iVar11 = 0;
        uVar14 = 0xffffffff;
      }
      else {
        local_90._M_head_impl = (int *)((long)(int)uVar13 + -2);
        lVar15 = 0;
        iVar11 = 0;
        uVar12 = 0xffffffffffffffff;
        do {
          uVar4 = local_a0._8_8_;
          uVar14 = uVar12 + 1;
          iVar11 = iVar11 + *(int *)(*(long *)(this + 0x50) + 0x14 + lVar15);
          iVar1 = *(int *)(*(long *)(this + 0x58) + local_78 * 4);
          lVar6 = (long)*(int *)(*(long *)(this + 0x50) + 0x10 + lVar15);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_a0._8_8_ + (lVar6 * 2 + 1) * 4));
          *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar6 * 2 * 4) * 0x10) =
               *(longdouble *)
                (*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar6 * 2 * 4) * 0x10) +
               delta + lVar16 * *(longdouble *)(*(long *)(this + 0x50) + lVar15) * (longdouble)0.5;
          if (iVar1 <= iVar11) break;
          lVar15 = lVar15 + 0x20;
          bVar5 = (long)uVar12 < (long)local_90._M_head_impl;
          uVar12 = uVar14;
        } while (bVar5);
      }
      uVar10 = (uint)uVar14;
      if (iVar11 < *(int *)(*(long *)(this + 0x58) + local_78 * 4)) {
        bVar5 = false;
      }
      else {
        bVar5 = iVar11 <= *(int *)(*(long *)(this + 0x58) + local_78 * 4 + 4);
      }
      if (((int)(uVar10 + 1) < (int)uVar13) && (bVar5)) {
        local_90._M_head_impl = (int *)(long)(int)uVar13;
        lVar15 = (long)(int)uVar10 << 5;
        lVar6 = (long)(int)uVar10 + 2;
        do {
          uVar4 = local_a0._8_8_;
          lVar8 = *(long *)(this + 0x50);
          iVar11 = iVar11 + *(int *)(lVar8 + 0x34 + lVar15);
          if (iVar11 < *(int *)(*(long *)(this + 0x58) + local_78 * 4)) {
            bVar5 = false;
          }
          else {
            bVar5 = iVar11 <= *(int *)(*(long *)(this + 0x58) + local_78 * 4 + 4);
          }
          lVar7 = (long)*(int *)(lVar8 + 0x30 + lVar15);
          if (bVar5) {
            lVar17 = *(longdouble *)(lVar8 + 0x20 + lVar15);
            lVar3 = (longdouble)0;
            if ((lVar17 != lVar3) || (NAN(lVar17) || NAN(lVar3))) {
              bVar5 = lVar17 < lVar3;
            }
            else {
              local_48 = lVar7;
              dVar18 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar5 = dVar18 < 0.5;
              lVar7 = local_48;
            }
          }
          if (bVar5) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar4 + (lVar7 * 2 + 1) * 4));
            lVar8 = *(long *)(this + 0x68);
            lVar7 = (long)*(int *)(uVar4 + lVar7 * 2 * 4) * 0x10;
            lVar17 = *(longdouble *)(lVar8 + lVar7) +
                     delta + lVar16 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar15) *
                                      (longdouble)0.5;
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar4 + (lVar7 * 2 + 1) * 4));
            lVar8 = *(long *)(this + 0x68);
            lVar7 = (long)*(int *)(uVar4 + lVar7 * 2 * 4) * 0x10;
            lVar17 = *(longdouble *)(lVar8 + lVar7) -
                     (delta + lVar16 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar15) *
                                       (longdouble)0.5);
          }
          *(longdouble *)(lVar8 + lVar7) = lVar17;
          bVar2 = lVar6 < (long)local_90._M_head_impl;
          uVar10 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar10;
          lVar15 = lVar15 + 0x20;
          lVar6 = lVar6 + 1;
        } while ((bool)(bVar2 & bVar5));
      }
      if ((int)(uVar10 + 1) < (int)uVar13) {
        lVar15 = (long)(int)uVar10 << 5;
        iVar11 = ~uVar10 + uVar13;
        do {
          uVar4 = local_a0._8_8_;
          lVar6 = (long)*(int *)(*(long *)(this + 0x50) + 0x30 + lVar15);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_a0._8_8_ + (lVar6 * 2 + 1) * 4));
          *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar6 * 2 * 4) * 0x10) =
               *(longdouble *)
                (*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar6 * 2 * 4) * 0x10) -
               (delta + *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar15) * (longdouble)0.5 *
                        lVar16);
          lVar15 = lVar15 + 0x20;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      bVar5 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                          *)this,(int)local_80._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                      ._M_head_impl,x);
      if (!bVar5) goto LAB_0019e368;
      first._M_current =
           (int *)((long)local_50._M_t.
                         super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                         .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                         _M_head_impl + 4);
    } while ((row_value *)first._M_current != local_58._M_head_impl);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }